

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O2

void avro::testLimits(EncoderPtr *e,DecoderPtr *d)

{
  element_type *this;
  lazy_ostream *plVar1;
  shared_count *this_00;
  undefined4 uVar2;
  float fVar3;
  double dVar4;
  char *local_1a8;
  char *local_1a0;
  lazy_ostream local_198;
  undefined8 *local_188;
  char *local_180;
  auto_ptr<avro::InputStream> s2;
  auto_ptr<avro::OutputStream> s1;
  assertion_result local_168;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  avro::memoryOutputStream((ulong)&s1);
  (**(code **)(*(long *)e->px + 0x10))(e->px,s1._M_ptr);
  (**(code **)(*(long *)e->px + 0x48))(0);
  (**(code **)(*(long *)e->px + 0x48))(0);
  (**(code **)(*(long *)e->px + 0x48))(0);
  (**(code **)(*(long *)e->px + 0x40))(0x7f800000);
  (**(code **)(*(long *)e->px + 0x40))(0xff800000);
  (**(code **)(*(long *)e->px + 0x40))(0x7fc00000);
  (**(code **)(*(long *)e->px + 0x18))();
  avro::memoryInputStream((OutputStream *)&s2);
  this = d->px;
  (**(code **)(*(long *)&this->field_0x0 + 0x10))(this,_s2);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x5ca,&local_50);
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ece70;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_118 = "";
  local_168._0_8_ = (**(code **)(*(long *)d->px + 0x40))();
  local_1a8 = (char *)0x7ff0000000000000;
  plVar1 = &local_198;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (plVar1,&local_120,0x5ca,1,2,&local_168,"d->decodeDouble()",&local_1a8,
             "std::numeric_limits<double>::infinity()");
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_60.m_end = "";
  local_70.m_begin = "";
  local_70.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar1,&local_60,0x5cc,&local_70);
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ece70;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_128 = "";
  local_168._0_8_ = (**(code **)(*(long *)d->px + 0x40))();
  local_1a8 = (char *)0xfff0000000000000;
  plVar1 = &local_198;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (plVar1,&local_130,0x5cc,1,2,&local_168,"d->decodeDouble()",&local_1a8,
             "-std::numeric_limits<double>::infinity()");
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_80.m_end = "";
  local_90.m_begin = "";
  local_90.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar1,&local_80,0x5cd,&local_90);
  dVar4 = (double)(**(code **)(*(long *)d->px + 0x40))();
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)NAN(dVar4);
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8 = "boost::math::isnan(d->decodeDouble())";
  local_1a0 = "";
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001eceb0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_a0.m_end = "";
  local_180 = (char *)&local_1a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,&local_198,&local_a0,0x5cd,CHECK,CHECK_PRED,0);
  this_00 = &local_168.m_message.pn;
  boost::detail::shared_count::~shared_count(this_00);
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_b0.m_end = "";
  local_c0.m_begin = "";
  local_c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_b0,0x5cf,&local_c0);
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ece70;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_138 = "";
  uVar2 = (**(code **)(*(long *)d->px + 0x38))();
  local_1a8._0_4_ = 0x7f800000;
  plVar1 = &local_198;
  local_168._0_4_ = uVar2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
            (plVar1,&local_140,0x5cf,1,2,&local_168,"d->decodeFloat()",&local_1a8,
             "std::numeric_limits<float>::infinity()");
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar1,&local_d0,0x5d1,&local_e0);
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ece70;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_148 = "";
  local_168._0_4_ = (**(code **)(*(long *)d->px + 0x38))();
  local_1a8 = (char *)CONCAT44(local_1a8._4_4_,0xff800000);
  plVar1 = &local_198;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
            (plVar1,&local_150,0x5d1,1,2,&local_168,"d->decodeFloat()",&local_1a8,
             "-std::numeric_limits<float>::infinity()");
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_f0.m_end = "";
  local_100.m_begin = "";
  local_100.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)plVar1,&local_f0,0x5d2,&local_100);
  fVar3 = (float)(**(code **)(*(long *)d->px + 0x38))();
  local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)NAN(fVar3);
  local_168.m_message.px = (element_type *)0x0;
  local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a8 = "boost::math::isnan(d->decodeFloat())";
  local_1a0 = "";
  local_198.m_empty = false;
  local_198._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001eceb0;
  local_188 = &boost::unit_test::lazy_ostream::inst;
  local_110.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_110.m_end = "";
  local_180 = (char *)&local_1a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_168,&local_198,&local_110,0x5d2,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
  if (_s2 != (long *)0x0) {
    (**(code **)(*_s2 + 8))();
  }
  if (s1._M_ptr != (OutputStream *)0x0) {
    (**(code **)(*(long *)s1._M_ptr + 8))();
  }
  return;
}

Assistant:

static void testLimits(const EncoderPtr& e, const DecoderPtr& d)
{
    std::auto_ptr<OutputStream> s1 = memoryOutputStream();
    {
        e->init(*s1);
        e->encodeDouble(std::numeric_limits<double>::infinity());
        e->encodeDouble(-std::numeric_limits<double>::infinity());
        e->encodeDouble(std::numeric_limits<double>::quiet_NaN());
        e->encodeFloat(std::numeric_limits<float>::infinity());
        e->encodeFloat(-std::numeric_limits<float>::infinity());
        e->encodeFloat(std::numeric_limits<float>::quiet_NaN());
        e->flush();
    }

    {
        std::auto_ptr<InputStream> s2 = memoryInputStream(*s1);
        d->init(*s2);
        BOOST_CHECK_EQUAL(d->decodeDouble(),
            std::numeric_limits<double>::infinity());
        BOOST_CHECK_EQUAL(d->decodeDouble(),
            -std::numeric_limits<double>::infinity());
        BOOST_CHECK(boost::math::isnan(d->decodeDouble()));
        BOOST_CHECK_EQUAL(d->decodeFloat(),
            std::numeric_limits<float>::infinity());
        BOOST_CHECK_EQUAL(d->decodeFloat(),
            -std::numeric_limits<float>::infinity());
        BOOST_CHECK(boost::math::isnan(d->decodeFloat()));
    }

}